

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O2

int feat_set_subvecs(feat_t *fcb,int32 **subvecs)

{
  uint uVar1;
  int iVar2;
  uint32 *puVar3;
  mfcc_t *pmVar4;
  int32 **ppiVar5;
  ulong uVar6;
  int32 *d;
  int *piVar7;
  uint uVar8;
  
  if (subvecs == (int32 **)0x0) {
    subvecs_free(fcb->subvecs);
    ckd_free(fcb->sv_buf);
    ckd_free(fcb->sv_len);
    *(undefined8 *)((long)&fcb->subvecs + 4) = 0;
    *(undefined8 *)((long)&fcb->sv_buf + 4) = 0;
    *(undefined8 *)&fcb->n_sv = 0;
    *(undefined8 *)((long)&fcb->sv_len + 4) = 0;
    iVar2 = 0;
  }
  else {
    if (fcb->n_stream == 1) {
      uVar1 = 0;
      uVar8 = 0;
      for (ppiVar5 = subvecs; piVar7 = *ppiVar5, piVar7 != (int *)0x0; ppiVar5 = ppiVar5 + 1) {
        for (; *piVar7 != -1; piVar7 = piVar7 + 1) {
          uVar8 = uVar8 + 1;
        }
        uVar1 = uVar1 + 1;
      }
      if (uVar8 <= fcb->out_dim) {
        fcb->n_sv = uVar1;
        fcb->subvecs = subvecs;
        puVar3 = (uint32 *)
                 __ckd_calloc__((ulong)uVar1,4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                                ,0x13d);
        fcb->sv_len = puVar3;
        pmVar4 = (mfcc_t *)
                 __ckd_calloc__((ulong)uVar8,4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                                ,0x13e);
        fcb->sv_buf = pmVar4;
        fcb->sv_dim = uVar8;
        for (uVar6 = 0; uVar6 != uVar1; uVar6 = uVar6 + 1) {
          for (piVar7 = subvecs[uVar6]; (piVar7 != (int *)0x0 && (*piVar7 != -1));
              piVar7 = piVar7 + 1) {
            fcb->sv_len[uVar6] = fcb->sv_len[uVar6] + 1;
          }
        }
        return 0;
      }
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
              ,0x137,
              "Total dimensionality of subvector specification %d > feature dimensionality %d\n",
              (ulong)uVar8);
    }
    else {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
              ,0x127,"Subvector specifications require single-stream features!");
    }
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int
feat_set_subvecs(feat_t *fcb, int32 **subvecs)
{
    int32 **sv;
    uint32 n_sv, n_dim, i;

    if (subvecs == NULL) {
        subvecs_free(fcb->subvecs);
        ckd_free(fcb->sv_buf);
        ckd_free(fcb->sv_len);
        fcb->n_sv = 0;
        fcb->subvecs = NULL;
        fcb->sv_len = NULL;
        fcb->sv_buf = NULL;
        fcb->sv_dim = 0;
        return 0;
    }

    if (fcb->n_stream != 1) {
        E_ERROR("Subvector specifications require single-stream features!");
        return -1;
    }

    n_sv = 0;
    n_dim = 0;
    for (sv = subvecs; sv && *sv; ++sv) {
        int32 *d;

        for (d = *sv; d && *d != -1; ++d) {
            ++n_dim;
        }
        ++n_sv;
    }
    if (n_dim > feat_dimension(fcb)) {
        E_ERROR("Total dimensionality of subvector specification %d "
                "> feature dimensionality %d\n", n_dim, feat_dimension(fcb));
        return -1;
    }

    fcb->n_sv = n_sv;
    fcb->subvecs = subvecs;
    fcb->sv_len = (uint32 *)ckd_calloc(n_sv, sizeof(*fcb->sv_len));
    fcb->sv_buf = (mfcc_t *)ckd_calloc(n_dim, sizeof(*fcb->sv_buf));
    fcb->sv_dim = n_dim;
    for (i = 0; i < n_sv; ++i) {
        int32 *d;
        for (d = subvecs[i]; d && *d != -1; ++d) {
            ++fcb->sv_len[i];
        }
    }

    return 0;
}